

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  sexp_conflict res;
  sexp_conflict ctx2;
  sexp_conflict ctx1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar4;
  sexp_conflict in_stack_ffffffffffffffb0;
  uint local_3c;
  
  lVar1 = sexp_make_eval_context(0,0,0,0);
  sexp_load_standard_env(lVar1,0,0xf);
  sexp_eval_string(lVar1,"(import (chibi net))",0xffffffffffffffff,0);
  check_exception(in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sexp_eval_string(lVar1,"(import (chibi time))",0xffffffffffffffff,0);
  check_exception(in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  lVar2 = sexp_make_eval_context(0,0,0,0);
  sexp_load_standard_env(lVar2,0,0xf);
  sexp_eval_string(lVar2,"(import (chibi time))",0xffffffffffffffff,0);
  check_exception(in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sexp_eval_string(lVar2,"(import (chibi net))",0xffffffffffffffff,0);
  check_exception(in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  puVar3 = (uint *)sexp_eval_string(lVar1,"(seconds->time 0)",0xffffffffffffffff,0);
  check_exception(in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((ulong)puVar3 & 3) == 0) {
    local_3c = *puVar3;
  }
  else {
    local_3c = 0xffffffff;
  }
  fprintf(_stderr,"ctx1: %p (%d): %s\n",puVar3,(ulong)local_3c,
          *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar1 + 0x28) + 0x20) + 0x10 +
                                       (ulong)*puVar3 * 8) + 8) + 8) + 0x10 +
          *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar1 + 0x28) + 0x20) + 0x10 +
                                       (ulong)*puVar3 * 8) + 8) + 0x10));
  puVar3 = (uint *)sexp_eval_string(lVar2,"(seconds->time 0)",0xffffffffffffffff,0);
  check_exception(in_stack_ffffffffffffffb0,
                  (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (((ulong)puVar3 & 3) == 0) {
    uVar4 = *puVar3;
  }
  else {
    uVar4 = 0xffffffff;
  }
  fprintf(_stderr,"ctx2: %p (%d): %s\n",puVar3,(ulong)uVar4,
          *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 0x28) + 0x20) + 0x10 +
                                       (ulong)*puVar3 * 8) + 8) + 8) + 0x10 +
          *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(lVar2 + 0x28) + 0x20) + 0x10 +
                                       (ulong)*puVar3 * 8) + 8) + 0x10));
  sexp_destroy_context(lVar1);
  sexp_destroy_context(lVar2);
  return 0;
}

Assistant:

int main (int argc, char **argv) {
  sexp ctx1, ctx2, res;

  /* Create a context and load two modules with C types. */
  ctx1 = sexp_make_eval_context(NULL, NULL, NULL, 0, 0);
  sexp_load_standard_env(ctx1, NULL, SEXP_SEVEN);
  CHECK(sexp_eval_string(ctx1, "(import (chibi net))", -1, NULL));
  CHECK(sexp_eval_string(ctx1, "(import (chibi time))", -1, NULL));

  /* Create another context and load the same modules in a different order. */
  ctx2 = sexp_make_eval_context(NULL, NULL, NULL, 0, 0);
  sexp_load_standard_env(ctx2, NULL, SEXP_SEVEN);
  CHECK(sexp_eval_string(ctx2, "(import (chibi time))", -1, NULL));
  CHECK(sexp_eval_string(ctx2, "(import (chibi net))", -1, NULL));

  /* Both instances of seconds->time should return the same type, */
  /* but with different tags. */
  CHECK(sexp_eval_string(ctx1, "(seconds->time 0)", -1, NULL));
  fprintf(stderr, "ctx1: %p (%d): %s\n", res, sexp_safe_pointer_tag(res),
          sexp_string_data(sexp_object_type_name(ctx1, res)));

  CHECK(sexp_eval_string(ctx2, "(seconds->time 0)", -1, NULL));
  fprintf(stderr, "ctx2: %p (%d): %s\n", res, sexp_safe_pointer_tag(res),
          sexp_string_data(sexp_object_type_name(ctx2, res)));

  /* Cleanup. */
  sexp_destroy_context(ctx1);
  sexp_destroy_context(ctx2);

  return 0;
}